

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,3>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  uint *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  bVar3 = (k->res).ulog2;
  iVar8 = 3 << (bVar3 & 0x1f);
  if (k->vw != 0) {
    puVar10 = (uint *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 6);
    puVar1 = (uint *)((long)puVar10 + (long)(k->vw * iVar8) * 2);
    pfVar7 = k->kv;
    iVar4 = k->uw;
    pfVar5 = k->ku;
    do {
      fVar14 = *pfVar5;
      fVar12 = (float)(ushort)puVar10[1] * fVar14;
      fVar13 = fVar14 * (float)(*puVar10 & 0xffff);
      fVar14 = fVar14 * (float)(*puVar10 >> 0x10);
      puVar9 = puVar10;
      lVar11 = (long)(iVar4 * 3) * 2 + -6;
      pfVar6 = pfVar5;
      if (iVar4 != 1) {
        do {
          puVar10 = (uint *)((long)puVar9 + 6);
          fVar2 = pfVar6[1];
          fVar13 = fVar13 + fVar2 * (float)(*(uint *)((long)puVar9 + 6) & 0xffff);
          fVar14 = fVar14 + fVar2 * (float)(*(uint *)((long)puVar9 + 6) >> 0x10);
          fVar12 = fVar12 + (float)*(ushort *)((long)puVar9 + 10) * fVar2;
          lVar11 = lVar11 + -6;
          puVar9 = puVar10;
          pfVar6 = pfVar6 + 1;
        } while (lVar11 != 0);
      }
      fVar2 = *pfVar7;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar14 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar13 + (float)*(undefined8 *)result);
      pfVar7 = pfVar7 + 1;
      result[2] = fVar12 * fVar2 + result[2];
      puVar10 = (uint *)((long)puVar10 + (long)(iVar8 + iVar4 * -3) * 2 + 6);
    } while (puVar10 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }